

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class1_test_matching.cc
# Opt level: O0

Ptr visualize_matching(Result *matching,Ptr *image1,Ptr *image2,
                      vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> *pos1
                      ,vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                       *pos2)

{
  size_type sVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  float *pfVar4;
  float *pfVar5;
  ostream *poVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pointer in_R9;
  Ptr PVar7;
  shared_ptr<const_core::Image<unsigned_char>_> local_b0;
  shared_ptr<const_core::Image<unsigned_char>_> local_a0;
  undefined1 local_8d;
  undefined1 local_80 [8];
  Correspondence2D2D match;
  ulong uStack_58;
  int j;
  size_t i;
  Correspondences2D2D vis_matches;
  vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> *pos2_local;
  vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> *pos1_local;
  Ptr *image2_local;
  Ptr *image1_local;
  Result *matching_local;
  Ptr *match_image;
  
  vis_matches.super__Vector_base<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = in_R9;
  std::vector<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>::vector
            ((vector<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_> *)&i);
  for (uStack_58 = 0;
      sVar1 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)image1), uStack_58 < sVar1;
      uStack_58 = uStack_58 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)image1,uStack_58);
    if (-1 < *pvVar2) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)image1,uStack_58);
      match.p2[1]._4_4_ = *pvVar2;
      pvVar3 = std::vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>::
               operator[](pos2,uStack_58);
      pfVar4 = math::Vector<float,_2>::begin(pvVar3);
      pvVar3 = std::vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>::
               operator[](pos2,uStack_58);
      pfVar5 = math::Vector<float,_2>::end(pvVar3);
      std::copy<float_const*,double*>(pfVar4,pfVar5,(double *)local_80);
      pvVar3 = std::vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>::
               operator[]((vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                           *)vis_matches.
                             super__Vector_base<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)match.p2[1]._4_4_);
      pfVar4 = math::Vector<float,_2>::begin(pvVar3);
      pvVar3 = std::vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>::
               operator[]((vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                           *)vis_matches.
                             super__Vector_base<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)match.p2[1]._4_4_);
      pfVar5 = math::Vector<float,_2>::end(pvVar3);
      std::copy<float_const*,double*>(pfVar4,pfVar5,match.p1 + 1);
      std::vector<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>::push_back
                ((vector<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_> *)&i,
                 (value_type *)local_80);
    }
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"Drawing ");
  sVar1 = std::vector<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>::size
                    ((vector<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_> *)&i
                    );
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar1);
  poVar6 = std::operator<<(poVar6," matches...");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  local_8d = 0;
  std::shared_ptr<core::Image<unsigned_char>const>::shared_ptr<core::Image<unsigned_char>,void>
            ((shared_ptr<core::Image<unsigned_char>const> *)&local_a0,image2);
  std::shared_ptr<core::Image<unsigned_char>const>::shared_ptr<core::Image<unsigned_char>,void>
            ((shared_ptr<core::Image<unsigned_char>const> *)&local_b0,
             (shared_ptr<core::Image<unsigned_char>_> *)pos1);
  features::Visualizer::draw_matches
            ((Visualizer *)matching,(ConstPtr *)&local_a0,(ConstPtr *)&local_b0,
             (Correspondences2D2D *)&i);
  std::shared_ptr<const_core::Image<unsigned_char>_>::~shared_ptr(&local_b0);
  std::shared_ptr<const_core::Image<unsigned_char>_>::~shared_ptr(&local_a0);
  local_8d = 1;
  std::vector<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>::~vector
            ((vector<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_> *)&i);
  PVar7.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  PVar7.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)matching;
  return (Ptr)PVar7.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

core::ByteImage::Ptr
visualize_matching (features::Matching::Result const& matching,
    core::ByteImage::Ptr image1, core::ByteImage::Ptr image2,
    std::vector<math::Vec2f> const& pos1, std::vector<math::Vec2f> const& pos2)
{
    /* Visualize keypoints. */
    sfm::Correspondences2D2D vis_matches;
    for (std::size_t i = 0; i < matching.matches_1_2.size(); ++i)
    {
        if (matching.matches_1_2[i] < 0)
            continue;
        int const j = matching.matches_1_2[i];

        sfm::Correspondence2D2D match;
        std::copy(pos1[i].begin(), pos1[i].end(), match.p1);
        std::copy(pos2[j].begin(), pos2[j].end(), match.p2);
        vis_matches.push_back(match);
    }

    std::cout << "Drawing " << vis_matches.size() << " matches..." << std::endl;
    core::ByteImage::Ptr match_image = sfm::Visualizer::draw_matches
        (image1, image2, vis_matches);
    return match_image;
}